

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.h
# Opt level: O3

bool __thiscall
luna::StackAPI::CheckArgs<luna::ValueT>
          (StackAPI *this,int index,int params,ValueT type,ValueT types)

{
  bool bVar1;
  ValueT VVar2;
  
  bVar1 = true;
  if (index != params) {
    VVar2 = GetValueType(this,index);
    if (VVar2 == type) {
      bVar1 = CheckArgs<>(this,index + 1,params,types);
      return bVar1;
    }
    ArgTypeError(this,index,type);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CheckArgs(int index, int params, ValueT type, ValueTypes... types)
        {
            // All arguments check success
            if (index == params)
                return true;

            // Check type of the index + 1 argument
            if (GetValueType(index) != type)
            {
                ArgTypeError(index, type);
                return false;
            }

            // Check remain arguments
            return CheckArgs(++index, params, types...);
        }